

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O3

void __thiscall S2Polyline::Shape::Init(Shape *this,S2Polyline *polyline)

{
  S2LogMessage SStack_28;
  
  if (polyline->num_vertices_ == 1) {
    S2LogMessage::S2LogMessage
              (&SStack_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.cc"
               ,0x279,kWarning,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_28.stream_,"S2Polyline::Shape with one vertex has no edges",0x2e);
    S2LogMessage::~S2LogMessage(&SStack_28);
  }
  this->polyline_ = polyline;
  return;
}

Assistant:

void S2Polyline::Shape::Init(const S2Polyline* polyline) {
  S2_LOG_IF(WARNING, polyline->num_vertices() == 1)
      << "S2Polyline::Shape with one vertex has no edges";
  polyline_ = polyline;
}